

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O1

REF_STATUS
ref_collapse_edge_twod_orientation(REF_GRID ref_grid,REF_INT keep,REF_INT remove,REF_BOOL *allowed)

{
  int iVar1;
  REF_CELL ref_cell;
  REF_ADJ_ITEM pRVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  REF_INT cell;
  ulong uVar6;
  REF_BOOL valid;
  REF_INT nodes [27];
  int local_bc;
  REF_BOOL *local_b8;
  REF_NODE local_b0;
  REF_INT local_a8 [30];
  
  local_b0 = ref_grid->node;
  *allowed = 0;
  ref_cell = ref_grid->cell[3];
  uVar6 = 0xffffffff;
  if (-1 < remove) {
    uVar6 = 0xffffffff;
    if (remove < ref_cell->ref_adj->nnode) {
      uVar6 = (ulong)(uint)ref_cell->ref_adj->first[(uint)remove];
    }
  }
  local_b8 = allowed;
  if ((int)uVar6 != -1) {
    cell = ref_cell->ref_adj->item[(int)uVar6].ref;
    do {
      uVar4 = ref_cell_nodes(ref_cell,cell,local_a8);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x428,"ref_collapse_edge_twod_orientation",(ulong)uVar4,"nodes");
        return uVar4;
      }
      if ((long)ref_cell->node_per < 1) {
LAB_00154357:
        if (0 < ref_cell->node_per) {
          lVar5 = 0;
          do {
            if (local_a8[lVar5] == remove) {
              local_a8[lVar5] = keep;
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < ref_cell->node_per);
        }
        uVar4 = ref_node_tri_twod_orientation(local_b0,local_a8,&local_bc);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0x438,"ref_collapse_edge_twod_orientation",(ulong)uVar4,"valid");
          return uVar4;
        }
        if (local_bc == 0) {
          return 0;
        }
      }
      else {
        lVar5 = 0;
        bVar3 = false;
        do {
          if (local_a8[lVar5] == keep) {
            bVar3 = true;
          }
          lVar5 = lVar5 + 1;
        } while (ref_cell->node_per != lVar5);
        if (!bVar3) goto LAB_00154357;
      }
      pRVar2 = ref_cell->ref_adj->item;
      iVar1 = pRVar2[(int)uVar6].next;
      uVar6 = (ulong)iVar1;
      if (uVar6 == 0xffffffffffffffff) {
        cell = -1;
      }
      else {
        cell = pRVar2[uVar6].ref;
      }
    } while (iVar1 != -1);
  }
  *local_b8 = 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_twod_orientation(REF_GRID ref_grid,
                                                      REF_INT keep,
                                                      REF_INT remove,
                                                      REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_BOOL will_be_collapsed, valid;

  *allowed = REF_FALSE;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, remove, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (keep == nodes[node]) {
        will_be_collapsed = REF_TRUE;
      }
    }
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (remove == nodes[node]) {
        nodes[node] = keep;
      }
    }

    RSS(ref_node_tri_twod_orientation(ref_node, nodes, &valid), "valid");
    if (!valid) return REF_SUCCESS;
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}